

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

MacroUsageSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MacroUsageSyntax,slang::syntax::MacroUsageSyntax_const&>
          (BumpAllocator *this,MacroUsageSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  MacroActualArgumentListSyntax *pMVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  MacroUsageSyntax *pMVar10;
  
  pMVar10 = (MacroUsageSyntax *)allocate(this,0x30,8);
  uVar5 = *(undefined4 *)&(args->super_DirectiveSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_DirectiveSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_DirectiveSyntax).super_SyntaxNode.previewNode;
  TVar6 = (args->super_DirectiveSyntax).directive.kind;
  uVar7 = (args->super_DirectiveSyntax).directive.field_0x2;
  NVar8.raw = (args->super_DirectiveSyntax).directive.numFlags.raw;
  uVar9 = (args->super_DirectiveSyntax).directive.rawLen;
  pIVar3 = (args->super_DirectiveSyntax).directive.info;
  pMVar4 = args->args;
  (pMVar10->super_DirectiveSyntax).super_SyntaxNode.kind =
       (args->super_DirectiveSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pMVar10->super_DirectiveSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pMVar10->super_DirectiveSyntax).super_SyntaxNode.parent = pSVar1;
  (pMVar10->super_DirectiveSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pMVar10->super_DirectiveSyntax).directive.kind = TVar6;
  (pMVar10->super_DirectiveSyntax).directive.field_0x2 = uVar7;
  (pMVar10->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar8.raw;
  (pMVar10->super_DirectiveSyntax).directive.rawLen = uVar9;
  (pMVar10->super_DirectiveSyntax).directive.info = pIVar3;
  pMVar10->args = pMVar4;
  return pMVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }